

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

int json_object_int_inc(json_object *jso,int64_t val)

{
  json_object_int *pjVar1;
  json_object_int *jsoint;
  int64_t val_local;
  json_object *jso_local;
  
  if ((jso == (json_object *)0x0) || (jso->o_type != json_type_int)) {
    jso_local._4_4_ = 0;
  }
  else {
    pjVar1 = JC_INT(jso);
    if (pjVar1->cint_type == json_object_int_type_int64) {
      if ((val < 1) || ((pjVar1->cint).c_int64 <= 0x7fffffffffffffff - val)) {
        if ((val < 0) && ((pjVar1->cint).c_int64 < -0x8000000000000000 - val)) {
          (pjVar1->cint).c_int64 = -0x8000000000000000;
        }
        else {
          (pjVar1->cint).c_int64 = val + (pjVar1->cint).c_int64;
        }
      }
      else {
        (pjVar1->cint).c_int64 = (pjVar1->cint).c_int64 + val;
        pjVar1->cint_type = json_object_int_type_uint64;
      }
      jso_local._4_4_ = 1;
    }
    else {
      if (pjVar1->cint_type != json_object_int_type_uint64) {
        json_abort("invalid cint_type");
      }
      if ((val < 1) || ((pjVar1->cint).c_uint64 <= -val - 1U)) {
        if ((val < 0) && ((pjVar1->cint).c_uint64 < (ulong)-val)) {
          (pjVar1->cint).c_int64 = (pjVar1->cint).c_int64 + val;
          pjVar1->cint_type = json_object_int_type_int64;
        }
        else if ((val < 0) && ((ulong)-val <= (pjVar1->cint).c_uint64)) {
          (pjVar1->cint).c_int64 = (pjVar1->cint).c_int64 + val;
        }
        else {
          (pjVar1->cint).c_int64 = val + (pjVar1->cint).c_int64;
        }
      }
      else {
        (pjVar1->cint).c_int64 = -1;
      }
      jso_local._4_4_ = 1;
    }
  }
  return jso_local._4_4_;
}

Assistant:

int json_object_int_inc(struct json_object *jso, int64_t val)
{
	struct json_object_int *jsoint;
	if (!jso || jso->o_type != json_type_int)
		return 0;
	jsoint = JC_INT(jso);
	switch (jsoint->cint_type)
	{
	case json_object_int_type_int64:
		if (val > 0 && jsoint->cint.c_int64 > INT64_MAX - val)
		{
			jsoint->cint.c_uint64 = (uint64_t)jsoint->cint.c_int64 + (uint64_t)val;
			jsoint->cint_type = json_object_int_type_uint64;
		}
		else if (val < 0 && jsoint->cint.c_int64 < INT64_MIN - val)
		{
			jsoint->cint.c_int64 = INT64_MIN;
		}
		else
		{
			jsoint->cint.c_int64 += val;
		}
		return 1;
	case json_object_int_type_uint64:
		if (val > 0 && jsoint->cint.c_uint64 > UINT64_MAX - (uint64_t)val)
		{
			jsoint->cint.c_uint64 = UINT64_MAX;
		}
		else if (val < 0 && jsoint->cint.c_uint64 < (uint64_t)(-val))
		{
			jsoint->cint.c_int64 = (int64_t)jsoint->cint.c_uint64 + val;
			jsoint->cint_type = json_object_int_type_int64;
		}
		else if (val < 0 && jsoint->cint.c_uint64 >= (uint64_t)(-val))
		{
			jsoint->cint.c_uint64 -= (uint64_t)(-val);
		}
		else
		{
			jsoint->cint.c_uint64 += val;
		}
		return 1;
	default: json_abort("invalid cint_type");
	}
}